

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void print_stack_union(FILE *out,lemon *lemp,int *plineno)

{
  byte *pbVar1;
  int iVar2;
  symbol **ppsVar3;
  symbol *psVar4;
  int iVar5;
  uint uVar6;
  void *__s;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  ushort **ppuVar10;
  void *pvVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  uint uVar17;
  char cVar18;
  long lVar19;
  size_t nByte;
  ulong uVar20;
  bool bVar21;
  
  iVar2 = lemp->nsymbol;
  uVar17 = iVar2 * 2;
  nByte = (long)iVar2 << 4;
  __s = lemon_malloc(nByte);
  sVar7 = 0;
  memset(__s,0,nByte);
  if (0 < (long)iVar2) {
    uVar14 = 1;
    if (1 < (int)uVar17) {
      uVar14 = (ulong)uVar17;
    }
    memset(__s,0,uVar14 << 3);
  }
  if (lemp->vartype != (char *)0x0) {
    sVar7 = strlen(lemp->vartype);
  }
  iVar15 = (int)sVar7;
  iVar5 = lemp->nsymbol;
  if (0 < (long)iVar5) {
    ppsVar3 = lemp->symbols;
    lVar19 = 0;
    do {
      pcVar9 = ppsVar3[lVar19]->datatype;
      if (pcVar9 != (char *)0x0) {
        sVar8 = strlen(pcVar9);
        uVar6 = (uint)sVar8;
        if ((int)(uint)sVar8 < (int)(uint)sVar7) {
          uVar6 = (uint)sVar7;
        }
        sVar7 = (size_t)uVar6;
      }
      iVar15 = (int)sVar7;
      lVar19 = lVar19 + 1;
    } while (iVar5 != lVar19);
  }
  pcVar9 = (char *)lemon_malloc((long)(iVar15 * 2 + 1));
  if (0 < lemp->nsymbol) {
    lVar19 = 0;
    do {
      uVar6 = uVar17 | 1;
      psVar4 = lemp->symbols[lVar19];
      if ((psVar4 == lemp->errsym) || (uVar6 = 0, psVar4->type != NONTERMINAL)) {
LAB_0010b3fc:
        psVar4->dtnum = uVar6;
      }
      else {
        pcVar16 = psVar4->datatype;
        if (pcVar16 == (char *)0x0) {
          if (lemp->vartype == (char *)0x0) goto LAB_0010b3fc;
          pcVar16 = lemp->vartype;
        }
        ppuVar10 = __ctype_b_loc();
        pcVar12 = pcVar16 + -1;
        do {
          pcVar16 = pcVar16 + 1;
          pbVar1 = (byte *)(pcVar12 + 1);
          pcVar12 = pcVar12 + 1;
        } while ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
        uVar14 = 0;
        cVar18 = *pcVar12;
        while (cVar18 != '\0') {
          pcVar9[uVar14] = cVar18;
          uVar14 = uVar14 + 1;
          cVar18 = *pcVar16;
          pcVar16 = pcVar16 + 1;
        }
        if (0 < (int)uVar14) {
          do {
            iVar5 = (int)uVar14;
            if ((*(byte *)((long)*ppuVar10 + (ulong)(byte)pcVar9[(uVar14 & 0xffffffff) - 1] * 2 + 1)
                & 0x20) == 0) goto LAB_0010b312;
            uVar14 = (ulong)(iVar5 - 1);
          } while (1 < iVar5);
          uVar14 = 0;
        }
LAB_0010b312:
        pcVar9[(int)uVar14] = '\0';
        if ((lemp->tokentype != (char *)0x0) && (iVar5 = strcmp(pcVar9,lemp->tokentype), iVar5 == 0)
           ) {
          uVar6 = 0;
          goto LAB_0010b3fc;
        }
        cVar18 = *pcVar9;
        uVar6 = 0;
        pcVar16 = pcVar9;
        if (cVar18 != '\0') {
          do {
            uVar6 = (int)cVar18 + uVar6 * 0x35;
            cVar18 = pcVar16[1];
            pcVar16 = pcVar16 + 1;
          } while (cVar18 != '\0');
          uVar6 = uVar6 & 0x7fffffff;
        }
        uVar14 = (ulong)uVar6 % (ulong)uVar17;
        pcVar16 = *(char **)((long)__s + uVar14 * 8);
        bVar21 = pcVar16 == (char *)0x0;
        if (bVar21) {
LAB_0010b41b:
          iVar15 = (int)uVar14;
LAB_0010b420:
          psVar4->dtnum = iVar15 + 1;
          sVar7 = strlen(pcVar9);
          pvVar11 = lemon_malloc((long)((int)sVar7 + 1));
          *(void **)((long)__s + uVar14 * 8) = pvVar11;
          lVar13 = 0;
          do {
            cVar18 = pcVar9[lVar13];
            *(char *)((long)pvVar11 + lVar13) = cVar18;
            lVar13 = lVar13 + 1;
          } while (cVar18 != '\0');
        }
        else {
          iVar5 = strcmp(pcVar16,pcVar9);
          while (iVar15 = (int)uVar14, iVar5 != 0) {
            uVar6 = iVar15 + 1U;
            if (uVar17 <= iVar15 + 1U) {
              uVar6 = 0;
            }
            uVar14 = (ulong)uVar6;
            pcVar16 = *(char **)((long)__s + uVar14 * 8);
            bVar21 = pcVar16 == (char *)0x0;
            if (bVar21) goto LAB_0010b41b;
            iVar5 = strcmp(pcVar16,pcVar9);
          }
          psVar4->dtnum = iVar15 + 1;
          if (bVar21) goto LAB_0010b420;
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < lemp->nsymbol);
  }
  pcVar16 = "Parse";
  if (lemp->name != (char *)0x0) {
    pcVar16 = lemp->name;
  }
  iVar5 = *plineno;
  fwrite("#[expect(non_camel_case_types)]\n",0x20,1,(FILE *)out);
  pcVar12 = "()";
  if (lemp->tokentype != (char *)0x0) {
    pcVar12 = lemp->tokentype;
  }
  fprintf((FILE *)out,"type %sTOKENTYPE<\'i> = %s;\n",pcVar16,pcVar12);
  fwrite("#[expect(non_camel_case_types)]\n",0x20,1,(FILE *)out);
  fwrite("enum YYMINORTYPE<\'i> {\n",0x17,1,(FILE *)out);
  fwrite("    yyinit(),\n",0xe,1,(FILE *)out);
  fprintf((FILE *)out,"    yy0(%sTOKENTYPE<\'i>),\n",pcVar16);
  iVar5 = iVar5 + 6;
  if (0 < iVar2) {
    uVar14 = 1;
    if (1 < (int)uVar17) {
      uVar14 = (ulong)uVar17;
    }
    uVar20 = 0;
    do {
      if (*(long *)((long)__s + uVar20 * 8) != 0) {
        fprintf((FILE *)out,"    yy%d(%s),\n",(ulong)((int)uVar20 + 1));
        iVar5 = iVar5 + 1;
      }
      uVar20 = uVar20 + 1;
    } while (uVar14 != uVar20);
  }
  psVar4 = lemp->errsym;
  if ((psVar4 != (symbol *)0x0) && (psVar4->useCnt != 0)) {
    fprintf((FILE *)out,"    yy%d(i32),\n",(ulong)(uint)psVar4->dtnum);
    iVar5 = iVar5 + 1;
  }
  memset(pcVar9,0,*(size_t *)(pcVar9 + -8));
  fwrite("}\n",2,1,(FILE *)out);
  fwrite("impl Default for YYMINORTYPE<\'_> {\n",0x23,1,(FILE *)out);
  fwrite("    fn default() -> Self {\n",0x1b,1,(FILE *)out);
  fwrite("        YYMINORTYPE::yyinit()\n",0x1e,1,(FILE *)out);
  fwrite("    }\n",6,1,(FILE *)out);
  fwrite("}\n",2,1,(FILE *)out);
  fwrite("impl<\'i> yyStackEntry<\'i> {\n",0x1c,1,(FILE *)out);
  fprintf((FILE *)out,"    fn yy0(self) -> %sTOKENTYPE<\'i> {\n",pcVar16);
  fwrite("        if let YYMINORTYPE::yy0(v) = self.minor {\n",0x32,1,(FILE *)out);
  fwrite("            v\n",0xe,1,(FILE *)out);
  fwrite("        } else {\n",0x11,1,(FILE *)out);
  fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
  fwrite("        }\n",10,1,(FILE *)out);
  fwrite("    }\n",6,1,(FILE *)out);
  iVar5 = iVar5 + 0xe;
  if (0 < iVar2) {
    uVar14 = 1;
    if (1 < (int)uVar17) {
      uVar14 = (ulong)uVar17;
    }
    uVar20 = 0;
    do {
      if (*(long *)((long)__s + uVar20 * 8) != 0) {
        uVar17 = (int)uVar20 + 1;
        fprintf((FILE *)out,"    fn yy%d(self) -> %s {\n",(ulong)uVar17);
        fprintf((FILE *)out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",(ulong)uVar17);
        fwrite("            v\n",0xe,1,(FILE *)out);
        fwrite("        } else {\n",0x11,1,(FILE *)out);
        fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
        fwrite("        }\n",10,1,(FILE *)out);
        fwrite("    }\n",6,1,(FILE *)out);
        fwrite("    #[allow(dead_code)]\n",0x18,1,(FILE *)out);
        fprintf((FILE *)out,"    fn yy%d_ref(&mut self) -> &mut %s {\n",(ulong)uVar17,
                *(undefined8 *)((long)__s + uVar20 * 8));
        fprintf((FILE *)out,"        if let YYMINORTYPE::yy%d(ref mut v) = self.minor {\n",
                (ulong)uVar17);
        fwrite("            v\n",0xe,1,(FILE *)out);
        fwrite("        } else {\n",0x11,1,(FILE *)out);
        fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
        fwrite("        }\n",10,1,(FILE *)out);
        fwrite("    }\n",6,1,(FILE *)out);
        iVar5 = iVar5 + 0xf;
        pvVar11 = *(void **)((long)__s + uVar20 * 8);
        if (pvVar11 != (void *)0x0) {
          memset(pvVar11,0,*(size_t *)((long)pvVar11 + -8));
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar14 != uVar20);
  }
  memset(__s,0,*(size_t *)((long)__s + -8));
  psVar4 = lemp->errsym;
  if ((psVar4 != (symbol *)0x0) && (psVar4->useCnt != 0)) {
    fprintf((FILE *)out,"    fn yy%d(self) -> i32 {\n",(ulong)(uint)psVar4->dtnum);
    fprintf((FILE *)out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",
            (ulong)(uint)lemp->errsym->dtnum);
    fwrite("            v\n",0xe,1,(FILE *)out);
    fwrite("        } else {\n",0x11,1,(FILE *)out);
    fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
    fwrite("        }\n",10,1,(FILE *)out);
    fwrite("    }\n",6,1,(FILE *)out);
    iVar5 = iVar5 + 7;
  }
  fwrite("}\n",2,1,(FILE *)out);
  *plineno = iVar5 + 1;
  return;
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno                /* Pointer to the line number */
){
  int lineno;               /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  unsigned hash;            /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)lemon_calloc( arraysize, sizeof(char*) );
  if( types==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }
  for(i=0; i<arraysize; i++) types[i] = 0;
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)lemon_malloc( maxdtlength*2 + 1 );
  if( stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( ISSPACE(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && ISSPACE(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=(unsigned)arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)lemon_malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      lemon_strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  fprintf(out,"#[expect(non_camel_case_types)]\n"); lineno++;
  fprintf(out,"type %sTOKENTYPE<'i> = %s;\n",name,
    lemp->tokentype?lemp->tokentype:"()");  lineno++;
  fprintf(out,"#[expect(non_camel_case_types)]\n"); lineno++;
  fprintf(out,"enum YYMINORTYPE<'i> {\n"); lineno++;
  fprintf(out,"    yyinit(),\n"); lineno++;
  fprintf(out,"    yy0(%sTOKENTYPE<'i>),\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"    yy%d(%s),\n",i+1,types[i]); lineno++;
//    lemon_free(types[i]);
  }
  if( lemp->errsym && lemp->errsym->useCnt ){
    fprintf(out,"    yy%d(i32),\n",lemp->errsym->dtnum); lineno++;
  }
  lemon_free(stddt);
  fprintf(out,"}\n"); lineno++;

  fprintf(out,"impl Default for YYMINORTYPE<'_> {\n"); lineno++;
  fprintf(out,"    fn default() -> Self {\n"); lineno++;
  fprintf(out,"        YYMINORTYPE::yyinit()\n"); lineno++;
  fprintf(out,"    }\n"); lineno++;
  fprintf(out,"}\n"); lineno++;

  fprintf(out,"impl<'i> yyStackEntry<'i> {\n"); lineno++;
  fprintf(out,"    fn yy0(self) -> %sTOKENTYPE<'i> {\n",name); lineno++;
  fprintf(out,"        if let YYMINORTYPE::yy0(v) = self.minor {\n"); lineno++;
  fprintf(out,"            v\n"); lineno++;
  fprintf(out,"        } else {\n"); lineno++;
  fprintf(out,"            unreachable!()\n"); lineno++;
  fprintf(out,"        }\n"); lineno++;
  fprintf(out,"    }\n"); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"    fn yy%d(self) -> %s {\n",i+1,types[i]); lineno++;
    fprintf(out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",i+1); lineno++;
    fprintf(out,"            v\n"); lineno++;
    fprintf(out,"        } else {\n"); lineno++;
    fprintf(out,"            unreachable!()\n"); lineno++; // TODO } else if YYMINORTYPE::yyinit() { return None;
    fprintf(out,"        }\n"); lineno++;
    fprintf(out,"    }\n"); lineno++;
    fprintf(out,"    #[allow(dead_code)]\n"); lineno++; // TODO generates only when needed
    fprintf(out,"    fn yy%d_ref(&mut self) -> &mut %s {\n",i+1,types[i]); lineno++;
    fprintf(out,"        if let YYMINORTYPE::yy%d(ref mut v) = self.minor {\n",i+1); lineno++;
    fprintf(out,"            v\n"); lineno++;
    fprintf(out,"        } else {\n"); lineno++;
    fprintf(out,"            unreachable!()\n"); lineno++;
    fprintf(out,"        }\n"); lineno++;
    fprintf(out,"    }\n"); lineno++;
    lemon_free(types[i]);
  }
  lemon_free(types);
  if( lemp->errsym && lemp->errsym->useCnt ){
    fprintf(out,"    fn yy%d(self) -> i32 {\n",lemp->errsym->dtnum); lineno++;
    fprintf(out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",lemp->errsym->dtnum); lineno++;
    fprintf(out,"            v\n"); lineno++;
    fprintf(out,"        } else {\n"); lineno++;
    fprintf(out,"            unreachable!()\n"); lineno++;
    fprintf(out,"        }\n"); lineno++;
    fprintf(out,"    }\n"); lineno++;
  }
  fprintf(out,"}\n"); lineno++;

  *plineno = lineno;
}